

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O0

Clause * __thiscall value_precede::ex_s(value_precede *this,int si,int ti)

{
  int iVar1;
  Clause *pCVar2;
  IntVar **ppIVar3;
  Lit *pLVar4;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  int ii_1;
  int ii;
  int jj;
  Clause *r;
  int i;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_28;
  uint local_20;
  
  pCVar2 = ::Reason_new(in_stack_ffffffffffffffd4);
  for (local_20 = 0; i = (int)((ulong)in_RDI >> 0x20), (int)local_20 < in_ESI;
      local_20 = local_20 + 1) {
    ppIVar3 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x20),local_20);
    iVar1 = (*((*ppIVar3)->super_Var).super_Branching._vptr_Branching[0xd])
                      (*ppIVar3,(long)*(int *)(in_RDI + 0x14),1);
    pLVar4 = Clause::operator[]((Clause *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),i);
    pLVar4->x = iVar1;
  }
  for (local_28 = in_ESI + 1; (int)local_28 < (int)in_EDX; local_28 = local_28 + 1) {
    ppIVar3 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x20),local_28);
    in_stack_ffffffffffffffd4 =
         (*((*ppIVar3)->super_Var).super_Branching._vptr_Branching[0xd])
                   (*ppIVar3,(long)*(int *)(in_RDI + 0x14),1);
    pLVar4 = Clause::operator[]((Clause *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),i);
    pLVar4->x = in_stack_ffffffffffffffd4;
  }
  ppIVar3 = vec<IntVar_*>::operator[]((vec<IntVar_*> *)(in_RDI + 0x20),in_EDX);
  iVar1 = (*((*ppIVar3)->super_Var).super_Branching._vptr_Branching[0xd])
                    (*ppIVar3,(long)*(int *)(in_RDI + 0x18),0);
  pLVar4 = Clause::operator[]((Clause *)CONCAT44(in_stack_ffffffffffffffd4,iVar1),i);
  pLVar4->x = iVar1;
  return pCVar2;
}

Assistant:

Clause* ex_s(int si, int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < si; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		for (int ii = si + 1; ii < ti; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		(*r)[jj++] = xs[ti]->getLit(t, LR_NE);
		assert(jj == ti + 1);
		return r;
	}